

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t isint_w(wchar_t *start,wchar_t *end,wchar_t *result)

{
  wchar_t local_2c;
  wchar_t n;
  wchar_t *result_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  local_2c = L'\0';
  end_local = start;
  if (start < end) {
    for (; end_local < end; end_local = end_local + 1) {
      if ((*end_local < L'0') || (L'9' < *end_local)) {
        return L'\0';
      }
      if ((local_2c < L'\x0ccccccd') &&
         ((local_2c != L'\x0ccccccc' || (*end_local + L'\xffffffd0' < 8)))) {
        local_2c = *end_local + L'\xffffffd0' + local_2c * 10;
      }
      else {
        local_2c = L'\x7fffffff';
      }
    }
    *result = local_2c;
    start_local._4_4_ = L'\x01';
  }
  else {
    start_local._4_4_ = L'\0';
  }
  return start_local._4_4_;
}

Assistant:

static int
isint_w(const wchar_t *start, const wchar_t *end, int *result)
{
	int n = 0;
	if (start >= end)
		return (0);
	while (start < end) {
		if (*start < '0' || *start > '9')
			return (0);
		if (n > (INT_MAX / 10) ||
		    (n == INT_MAX / 10 && (*start - '0') > INT_MAX % 10)) {
			n = INT_MAX;
		} else {
			n *= 10;
			n += *start - '0';
		}
		start++;
	}
	*result = n;
	return (1);
}